

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void POOL_add_internal(POOL_ctx *ctx,POOL_function function,void *opaque)

{
  POOL_job *pPVar1;
  size_t sVar2;
  POOL_job job;
  void *opaque_local;
  POOL_function function_local;
  POOL_ctx *ctx_local;
  
  if (ctx == (POOL_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x143f,"void POOL_add_internal(POOL_ctx *, POOL_function, void *)");
  }
  if (ctx->shutdown == 0) {
    ctx->queueEmpty = 0;
    pPVar1 = ctx->queue;
    sVar2 = ctx->queueTail;
    pPVar1[sVar2].function = function;
    pPVar1[sVar2].opaque = opaque;
    ctx->queueTail = (ctx->queueTail + 1) % ctx->queueSize;
    pthread_cond_signal((pthread_cond_t *)&ctx->queuePopCond);
  }
  return;
}

Assistant:

static void POOL_add_internal(POOL_ctx* ctx, POOL_function function, void *opaque)
{
    POOL_job const job = {function, opaque};
    assert(ctx != NULL);
    if (ctx->shutdown) return;

    ctx->queueEmpty = 0;
    ctx->queue[ctx->queueTail] = job;
    ctx->queueTail = (ctx->queueTail + 1) % ctx->queueSize;
    ZSTD_pthread_cond_signal(&ctx->queuePopCond);
}